

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O0

IDiagObjectAddress * __thiscall
Js::DiagScopeVariablesWalker::FindPropertyAddress
          (DiagScopeVariablesWalker *this,PropertyId propId,bool *isConst)

{
  Type pIVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  Type *ppIVar5;
  undefined4 *puVar6;
  undefined4 extraout_var;
  IDiagObjectModelWalkerBase *pObjWalker;
  int j;
  IDiagObjectAddress *address;
  bool *isConst_local;
  PropertyId propId_local;
  DiagScopeVariablesWalker *this_local;
  
  GetChildrenCount(this);
  if (this->pDiagScopeObjects !=
      (List<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
       *)0x0) {
    for (pObjWalker._4_4_ = 0;
        iVar4 = JsUtil::
                ReadOnlyList<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>
                ::Count(&this->pDiagScopeObjects->
                         super_ReadOnlyList<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>
                       ), pObjWalker._4_4_ < iVar4; pObjWalker._4_4_ = pObjWalker._4_4_ + 1) {
      ppIVar5 = JsUtil::
                List<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                ::Item(this->pDiagScopeObjects,pObjWalker._4_4_);
      pIVar1 = *ppIVar5;
      if (pIVar1 == (Type)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                    ,0x418,"(pObjWalker)","pObjWalker");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
      iVar4 = (*pIVar1->_vptr_IDiagObjectModelWalkerBase[3])(pIVar1,(ulong)(uint)propId,isConst);
      if ((IDiagObjectAddress *)CONCAT44(extraout_var,iVar4) != (IDiagObjectAddress *)0x0) {
        return (IDiagObjectAddress *)CONCAT44(extraout_var,iVar4);
      }
    }
  }
  return (IDiagObjectAddress *)0x0;
}

Assistant:

IDiagObjectAddress * DiagScopeVariablesWalker::FindPropertyAddress(PropertyId propId, bool& isConst)
    {
        IDiagObjectAddress * address = nullptr;

        // Ensure that children are fetched.
        GetChildrenCount();

        if (pDiagScopeObjects)
        {
            for (int j = 0; j < pDiagScopeObjects->Count(); j++)
            {
                IDiagObjectModelWalkerBase *pObjWalker = pDiagScopeObjects->Item(j);
                Assert(pObjWalker);

                address = pObjWalker->FindPropertyAddress(propId, isConst);
                if (address != nullptr)
                {
                    break;
                }
            }
        }

        return address;
    }